

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

void helicsFederateInitializingEntryCallback
               (HelicsFederate fed,_func_void_HelicsBool_void_ptr *initializingEntry,void *userdata,
               HelicsError *err)

{
  Federate *this;
  _Any_data *this_00;
  _Any_data local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  this_00 = &local_68;
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (initializingEntry == (_func_void_HelicsBool_void_ptr *)0x0) {
      local_58 = 0;
      uStack_50 = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      helics::Federate::setInitializingEntryCallback(this,(function<void_(bool)> *)&local_68);
    }
    else {
      local_28 = std::
                 _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1307:17)>
                 ::_M_invoke;
      local_30 = std::
                 _Function_handler<void_(bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/shared_api_library/FederateExport.cpp:1307:17)>
                 ::_M_manager;
      local_40._M_unused._0_8_ = (undefined8)initializingEntry;
      local_40._8_8_ = userdata;
      helics::Federate::setInitializingEntryCallback(this,(function<void_(bool)> *)&local_40);
      this_00 = &local_40;
    }
    std::_Function_base::~_Function_base((_Function_base *)this_00);
  }
  return;
}

Assistant:

void helicsFederateInitializingEntryCallback(HelicsFederate fed,
                                             void (*initializingEntry)(HelicsBool iterating, void* userdata),
                                             void* userdata,
                                             HelicsError* err)
{
    auto* fedptr = getFed(fed, err);
    if (fedptr == nullptr) {
        return;
    }

    try {
        if (initializingEntry == nullptr) {
            fedptr->setInitializingEntryCallback({});
        } else {
            fedptr->setInitializingEntryCallback(
                [initializingEntry, userdata](bool iterating) { initializingEntry(iterating ? HELICS_TRUE : HELICS_FALSE, userdata); });
        }
    }
    catch (...) {  // LCOV_EXCL_LINE
        helicsErrorHandler(err);  // LCOV_EXCL_LINE
    }
}